

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O2

void Rwr_ManPrecompute(Rwr_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Rwr_Node_t *pRVar4;
  Rwr_Node_t *p1;
  uint *puVar5;
  int i;
  int Level;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  int iVar8;
  uint local_58;
  uint local_54;
  
  local_54 = 0xffffffff;
  iVar8 = 0;
  local_58 = 1;
  do {
    if (p->vForest->nSize <= (int)local_58) {
LAB_003aefa7:
      Rwr_ManIncTravId(p);
      uVar7 = 0;
      iVar8 = 5;
      while( true ) {
        pVVar6 = p->vForest;
        iVar1 = pVVar6->nSize;
        if (iVar1 <= iVar8) break;
        pRVar4 = (Rwr_Node_t *)Vec_PtrEntry(pVVar6,iVar8);
        if (p->puCanons[*(uint *)&pRVar4->field_0xe & 0xffff] ==
            (unsigned_short)*(uint *)&pRVar4->field_0xe) {
          Rwr_MarkUsed_rec(p,pRVar4);
          uVar7 = uVar7 + 1;
        }
        iVar8 = iVar8 + 1;
      }
      uVar2 = 5;
      iVar8 = 5;
      while( true ) {
        if (iVar1 <= iVar8) break;
        puVar5 = (uint *)Vec_PtrEntry(pVVar6,iVar8);
        if ((*(byte *)((long)puVar5 + 0x11) & 0x40) != 0) {
          p->vForest->pArray[(int)uVar2] = puVar5;
          *puVar5 = uVar2;
          uVar2 = uVar2 + 1;
        }
        iVar8 = iVar8 + 1;
        pVVar6 = p->vForest;
        iVar1 = pVVar6->nSize;
      }
      pVVar6->nSize = uVar2;
      printf("Total canonical = %4d. Total used = %5d.\n",(ulong)uVar7,(ulong)uVar2);
      return;
    }
    pRVar4 = (Rwr_Node_t *)Vec_PtrEntry(p->vForest,local_58);
    pVVar6 = p->vForest;
    iVar1 = pVVar6->nSize;
    i = 1;
    while (i < iVar1) {
      p1 = (Rwr_Node_t *)Vec_PtrEntry(pVVar6,i);
      uVar7 = (byte)pRVar4->field_0x11 & 0x3f;
      if ((int)local_54 < (int)uVar7) {
        printf("Starting level %d  (at %d nodes).\n",(ulong)(uVar7 + 1),(ulong)local_58);
        printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
               (long)p->nConsidered / 1000000 & 0xffffffff,(ulong)(uint)p->vForest->nSize,
               (ulong)(uint)p->nClasses,(ulong)local_58);
        local_54 = uVar7;
      }
      if (iVar8 + i == 1) break;
      uVar2 = (byte)pRVar4->field_0x11 & 0x3f;
      uVar7 = (byte)p1->field_0x11 & 0x3f;
      if (5 < uVar2 + uVar7) break;
      if (uVar7 < uVar2) {
        uVar7 = uVar2;
      }
      Level = uVar7 + 1;
      iVar3 = Rwr_ManNodeVolume(p,pRVar4,p1);
      iVar1 = iVar3 + 1;
      Rwr_ManTryNode(p,pRVar4,p1,0,Level,iVar1);
      Rwr_ManTryNode(p,(Rwr_Node_t *)((ulong)pRVar4 ^ 1),p1,0,Level,iVar1);
      Rwr_ManTryNode(p,pRVar4,(Rwr_Node_t *)((ulong)p1 ^ 1),0,Level,iVar1);
      Rwr_ManTryNode(p,(Rwr_Node_t *)((ulong)pRVar4 ^ 1),(Rwr_Node_t *)((ulong)p1 ^ 1),0,Level,iVar1
                    );
      Rwr_ManTryNode(p,pRVar4,p1,1,Level,iVar3 + 2);
      if (p->nConsidered % 50000000 == 0) {
        printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
               (long)p->nConsidered / 1000000 & 0xffffffff,(ulong)(uint)p->vForest->nSize,
               (ulong)(uint)p->nClasses,(ulong)local_58);
      }
      i = i + 1;
      pVVar6 = p->vForest;
      iVar1 = pVVar6->nSize;
      if (iVar1 == 0x40005) {
        printf("Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n",
               (long)p->nConsidered / 1000000 & 0xffffffff,0x40005,(ulong)(uint)p->nClasses,
               (ulong)local_58);
        goto LAB_003aefa7;
      }
    }
    local_58 = local_58 + 1;
    iVar8 = iVar8 + -1;
  } while( true );
}

Assistant:

void Rwr_ManPrecompute( Rwr_Man_t * p )
{
    Rwr_Node_t * p0, * p1;
    int i, k, Level, Volume;
    int LevelOld = -1;
    int nNodes;

    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 1 )
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p1, k, 1 )
    {
        if ( LevelOld < (int)p0->Level )
        {
            LevelOld = p0->Level;
            printf( "Starting level %d  (at %d nodes).\n", LevelOld+1, i );
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
        }

        if ( k == i )
            break;
//        if ( p0->Level + p1->Level > 6 ) // hard
//            break;

        if ( p0->Level + p1->Level > 5 ) // easy 
            break;

//        if ( p0->Level + p1->Level > 6 || (p0->Level == 3 && p1->Level == 3) )
//            break;

        // compute the level and volume of the new nodes
        Level  = 1 + Abc_MaxInt( p0->Level, p1->Level );
        Volume = 1 + Rwr_ManNodeVolume( p, p0, p1 );
        // try four different AND nodes
        Rwr_ManTryNode( p,         p0 ,         p1 , 0, Level, Volume );
        Rwr_ManTryNode( p, Rwr_Not(p0),         p1 , 0, Level, Volume );
        Rwr_ManTryNode( p,         p0 , Rwr_Not(p1), 0, Level, Volume );
        Rwr_ManTryNode( p, Rwr_Not(p0), Rwr_Not(p1), 0, Level, Volume );
        // try EXOR
        Rwr_ManTryNode( p,         p0 ,         p1 , 1, Level, Volume + 1 );
        // report the progress
        if ( p->nConsidered % 50000000 == 0 )
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
        // quit after some time
        if ( p->vForest->nSize == RWR_LIMIT + 5 )
        {
            printf( "Considered = %5d M.   Found = %8d.   Classes = %6d.   Trying %7d.\n", 
                p->nConsidered/1000000, p->vForest->nSize, p->nClasses, i );
            goto save;
        }
    }
save :

    // mark the relevant ones
    Rwr_ManIncTravId( p );
    k = 5;
    nNodes = 0;
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 5 )
        if ( p0->uTruth == p->puCanons[p0->uTruth] )
        {
            Rwr_MarkUsed_rec( p, p0 );
            nNodes++;
        }

    // compact the array by throwing away non-canonical
    k = 5;
    Vec_PtrForEachEntryStart( Rwr_Node_t *, p->vForest, p0, i, 5 )
        if ( p0->fUsed )
        {
            p->vForest->pArray[k] = p0;
            p0->Id = k++;
        }
    p->vForest->nSize = k;
    printf( "Total canonical = %4d. Total used = %5d.\n", nNodes, p->vForest->nSize );
}